

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

void system_init(void)

{
  int local_10 [2];
  int gmode;
  int gdriver;
  
  local_10[1] = 0;
  local_10[0] = 0;
  output = (FILE *)fopen("./output.dat","wb");
  textmode(0);
  clrscr();
  textbackground(0xe);
  textcolor(0xf);
  cprintf(" Softbeeb Initialisation \n\n\r");
  textbackground(0xc);
  textbackground(0xd);
  init_decode();
  init_mem();
  rinit_io();
  winit_io();
  graphics_init();
  textmode(0);
  initgraph(local_10 + 1,local_10,"");
  titlepic();
  restorecrtmode();
  textcolor(0xd);
  printf("_________________________\n\n");
  clrscr();
  return;
}

Assistant:

void system_init(void) {
    int gdriver = VGA, gmode = VGAMED;
    output = fopen("./output.dat", "wb");

//	unsigned int c;
//	unsigned char test[]={END};

    textmode(C80);        // intialise the screen mode
    clrscr();            // clear the screen

    textbackground(BLUE);//display pretty startup screen
    textcolor(YELLOW);
    cprintf(" Softbeeb Initialisation \n\n\r");
    textbackground(BLACK);
    textbackground(WHITE);
    init_decode();       // initialise the 6502 processor emulator
    init_mem();          // initialise the memory
    rinit_io();                // initialize the read io system
    winit_io();          // initialise the write io system
    graphics_init();        // initialise the graphics system
    textmode(C40);
    initgraph(&gdriver, &gmode, "");
    titlepic();
    restorecrtmode();
    textcolor(WHITE);
    printf("_________________________\n\n"); // display end of startup line
    clrscr();
/*
	// instructions for testing purposes

	pc=0x4000;
	for (c=0;(c<sizeof(test)+1);c++) putbyte(test[c2],pc+c2);

	// ***********  SETUP FOR TESTS GOES HERE *********

	// ************************************************
*/

}